

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O3

void __thiscall re2c::If::emit(If *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  if (this->type == LINEAR) {
    Linear::emit((this->info).linear,o,ind,readCh);
    return;
  }
  if (this->type == BINARY) {
    Binary::emit((this->info).binary,o,ind,readCh);
    return;
  }
  return;
}

Assistant:

void If::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	switch (type)
	{
		case BINARY:
			info.binary->emit (o, ind, readCh);
			break;
		case LINEAR:
			info.linear->emit (o, ind, readCh);
			break;
	}
}